

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

void read_and_smooth3D(char *path,char *stem,float sigma,float (*floatpic) [512] [512],
                      uchar (*pic) [512] [512],uchar (*inpic) [512] [512],int start,int middle,
                      int end,uchar *header)

{
  int local_50;
  int local_4c;
  int frame;
  int time;
  int k;
  int j;
  int i;
  int start_local;
  uchar (*inpic_local) [512] [512];
  uchar (*pic_local) [512] [512];
  float (*floatpic_local) [512] [512];
  float sigma_local;
  char *stem_local;
  char *path_local;
  
  for (frame = 0; frame < 5; frame = frame + 1) {
    for (k = 0; k < 0x200; k = k + 1) {
      for (time = 0; time < 0x200; time = time + 1) {
        floatpic[frame][k][time] = 0.0;
      }
    }
  }
  pic_t = (end - start) + 1;
  readfiles(path,stem,inpic,sigma,pic_t,&pic_x,&pic_y,start,end,header);
  if ((sigma != 0.0) || (NAN(sigma))) {
    printf("Number of columns: %d Number of rows: %d\n",(ulong)(uint)pic_y,(ulong)(uint)pic_x);
    if ((0x200 < pic_x) || (0x200 < pic_y)) {
      printf("Fatal error: images are too big\n");
      exit(1);
    }
    fflush(_stdout);
    local_4c = -1;
    if (OUTPUT_SMOOTH != 0) {
      printf("Start: %d End: %d Middle: %d\n",(ulong)(uint)start,(ulong)(uint)end,
             (ulong)(uint)middle);
    }
    for (local_50 = middle + -2; local_50 <= middle + 2; local_50 = local_50 + 1) {
      local_4c = local_4c + 1;
      convolve_Gaussian(inpic,floatpic,pic,sigma,pic_t,pic_x,pic_y,start,middle + -2 + local_4c,
                        local_4c);
    }
    printf("Input files smoothed\n");
  }
  else {
    for (frame = 0; frame < 5; frame = frame + 1) {
      for (k = 0; k < pic_x; k = k + 1) {
        for (time = 0; time < pic_y; time = time + 1) {
          floatpic[frame][k][time] = (float)inpic[frame][k][time];
        }
      }
    }
  }
  return;
}

Assistant:

void read_and_smooth3D(char path[], char stem[],
float sigma, float floatpic[][PIC_X][PIC_Y],
 unsigned char pic[][PIC_X][PIC_Y],
unsigned char inpic[][PIC_X][PIC_Y],
int start, int middle, int end,
unsigned char header[])
{
int i,j,k,time,frame;

for(k=0;k<FIVE;k++)
for(i=0;i<PIC_X;i++)
for(j=0;j<PIC_Y;j++)
	floatpic[k][i][j] = 0.0;

pic_t = end-start+1;


readfiles(path,stem,inpic,sigma,pic_t,&pic_x,&pic_y,start,end,header);
if(sigma==0.0)
	{
	for(k=0;k<FIVE;k++)
	for(i=0;i<pic_x;i++)
	for(j=0;j<pic_y;j++)
		floatpic[k][i][j] = inpic[k][i][j];
	return;
	}

printf("Number of columns: %d Number of rows: %d\n",pic_y,pic_x);
if(pic_x > PIC_X || pic_y > PIC_Y)
	{
	printf("Fatal error: images are too big\n");
	exit(1);
	}
fflush(stdout);

time = -1;
frame = middle-2;
if(OUTPUT_SMOOTH) printf("Start: %d End: %d Middle: %d\n",start,end,middle);
for(frame=middle-2;frame<=middle+2;frame++)
	{
	time++;
	convolve_Gaussian(inpic,floatpic,pic,sigma,pic_t,pic_x,pic_y,
		start,middle-2+time,time);
	}
printf("Input files smoothed\n");
}